

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.h
# Opt level: O0

void __thiscall puppup::Game::ply(Game *this,Move m,bool fill_rack)

{
  reference pvVar1;
  iterator __first;
  iterator __last;
  long lVar2;
  bool fill_rack_local;
  Game *this_local;
  
  if (this->winner_ == -1) {
    pvVar1 = std::array<std::array<long,_32UL>,_2UL>::operator[](&this->racks_,this->turn_);
    movegen::makeMove(&this->state_,pvVar1,&this->population_,&m,this->gaddag_);
    if (fill_rack) {
      if ((this->out_of_tiles_ & 1U) == 0) {
        pvVar1 = std::array<std::array<long,_32UL>,_2UL>::operator[](&this->racks_,this->turn_);
        fillRack<std::array<long,32ul>>(this,pvVar1);
      }
      else {
        pvVar1 = std::array<std::array<long,_32UL>,_2UL>::operator[](&this->racks_,this->turn_);
        __first = std::array<long,_32UL>::begin(pvVar1);
        pvVar1 = std::array<std::array<long,_32UL>,_2UL>::operator[](&this->racks_,this->turn_);
        __last = std::array<long,_32UL>::end(pvVar1);
        lVar2 = std::accumulate<long*,long>(__first,__last,0);
        if (lVar2 == 0) {
          checkWinner(this);
          return;
        }
      }
    }
    this->turn_ = this->turn_ ^ 1;
    (this->state_).score = -(this->state_).score;
  }
  return;
}

Assistant:

void ply(movegen::Move m, const bool fill_rack = true) {
        if (winner_ != -1) {
            return;
        }
        movegen::makeMove(state_, racks_[turn_], population_, m, gaddag_);
        if (fill_rack) {
            if (!out_of_tiles_) {
                fillRack(racks_[turn_]);
            } else if (!std::accumulate(racks_[turn_].begin(),
                                        racks_[turn_].end(), idx(0))) {
                checkWinner();
                return;
            }
        }
        turn_ ^= 1;
        state_.score *= -1;
    }